

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

Option * getOptionPred(StringRef Name,size_t *Length,_func_bool_Option_ptr *Pred,
                      StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  StringMapEntryBase **ppSVar5;
  ulong uVar6;
  StringMapEntryBase **ppSVar7;
  ulong uVar8;
  StringRef Key;
  
  uVar6 = Name.Length;
  iVar2 = llvm::StringMapImpl::FindKey(&OptionsMap->super_StringMapImpl,Name);
  uVar4 = (ulong)(OptionsMap->super_StringMapImpl).NumBuckets;
  uVar3 = (long)iVar2;
  if (iVar2 == -1) {
    uVar3 = uVar4;
  }
  uVar8 = uVar6;
  if (uVar6 < 2 || uVar3 * 8 + uVar4 * -8 != 0) {
    ppSVar5 = (OptionsMap->super_StringMapImpl).TheTable;
    ppSVar7 = ppSVar5 + uVar3;
    ppSVar5 = ppSVar5 + uVar4;
  }
  else {
    do {
      uVar6 = uVar8 - 1;
      if (uVar8 < uVar8 - 1) {
        uVar6 = uVar8;
      }
      Key.Length = uVar6;
      Key.Data = Name.Data;
      iVar2 = llvm::StringMapImpl::FindKey(&OptionsMap->super_StringMapImpl,Key);
      uVar4 = (ulong)(OptionsMap->super_StringMapImpl).NumBuckets;
      uVar3 = (long)iVar2;
      if (iVar2 == -1) {
        uVar3 = uVar4;
      }
    } while ((uVar3 == uVar4) && (uVar8 = uVar6, 1 < uVar6));
    ppSVar7 = (OptionsMap->super_StringMapImpl).TheTable;
    ppSVar5 = ppSVar7 + uVar4;
    ppSVar7 = ppSVar7 + uVar3;
  }
  if ((ppSVar7 != ppSVar5) && (bVar1 = (*Pred)((Option *)(*ppSVar7)[1].StrLen), bVar1)) {
    *Length = uVar6;
    return (Option *)(*ppSVar7)[1].StrLen;
  }
  return (Option *)0x0;
}

Assistant:

static Option *getOptionPred(StringRef Name, size_t &Length,
                             bool (*Pred)(const Option *),
                             const StringMap<Option *> &OptionsMap) {

  StringMap<Option *>::const_iterator OMI = OptionsMap.find(Name);

  // Loop while we haven't found an option and Name still has at least two
  // characters in it (so that the next iteration will not be the empty
  // string.
  while (OMI == OptionsMap.end() && Name.size() > 1) {
    Name = Name.substr(0, Name.size() - 1); // Chop off the last character.
    OMI = OptionsMap.find(Name);
  }

  if (OMI != OptionsMap.end() && Pred(OMI->second)) {
    Length = Name.size();
    return OMI->second; // Found one!
  }
  return nullptr; // No option found!
}